

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx512vnni.cpp
# Opt level: O0

void ncnn::transpose_pack_B_tile_int8_avx512vnni(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  int in_stack_00000298;
  int in_stack_0000029c;
  int in_stack_000002a0;
  int in_stack_000002a4;
  Mat *in_stack_000002a8;
  Mat *in_stack_000002b0;
  
  transpose_pack_B_tile_int8
            (in_stack_000002b0,in_stack_000002a8,in_stack_000002a4,in_stack_000002a0,
             in_stack_0000029c,in_stack_00000298);
  return;
}

Assistant:

void transpose_pack_B_tile_int8_avx512vnni(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    transpose_pack_B_tile_int8(B, BT, j, max_jj, k, max_kk);
}